

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

void EVAL_pawn_types(chess_state_t *s,bitboard_t *attack,bitboard_t *passedPawns,
                    bitboard_t *isolatedPawns)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = s->bitboard[0];
  uVar2 = s->bitboard[7];
  uVar5 = (uVar1 & 0x7f7f7f7f7f7f7f) << 9 | (uVar1 & 0xfefefefefefefe) << 7;
  *attack = uVar5;
  uVar6 = uVar2 >> 7 & 0xfefefefefefefe | uVar2 >> 9 & 0x7f7f7f7f7f7f7f;
  attack[1] = uVar6;
  uVar3 = uVar1 << 8 | uVar1;
  uVar3 = uVar3 << 0x10 | uVar3;
  uVar4 = uVar2 >> 8 | uVar2;
  uVar4 = uVar4 >> 0x10 | uVar4;
  uVar5 = uVar5 << 8 | uVar5;
  uVar5 = uVar5 << 0x10 | uVar5;
  uVar5 = uVar5 << 0x20 | uVar5;
  uVar6 = uVar6 >> 8 | uVar6;
  uVar6 = uVar6 >> 0x10 | uVar6;
  uVar6 = uVar6 >> 0x20 | uVar6;
  uVar5 = uVar5 >> 8 | uVar5;
  uVar5 = uVar5 >> 0x10 | uVar5;
  uVar6 = uVar6 << 8 | uVar6;
  uVar6 = uVar6 << 0x10 | uVar6;
  *passedPawns = ~(uVar3 << 0x20 | uVar3 | uVar5) & uVar2 | ~(uVar4 >> 0x20 | uVar4 | uVar6) & uVar1
  ;
  *isolatedPawns = ~(uVar6 << 0x20 | uVar6) & uVar2 | ~(uVar5 >> 0x20 | uVar5) & uVar1;
  return;
}

Assistant:

void EVAL_pawn_types(const chess_state_t *s, bitboard_t attack[NUM_COLORS], bitboard_t *passedPawns, bitboard_t *isolatedPawns)
{
    bitboard_t pawns[2];
    bitboard_t frontFill[2];
    bitboard_t attackSpan[2];
    bitboard_t attackFrontFill[2];
    bitboard_t attackFileFill[2];

    /* Location of pawns */
    pawns[WHITE] = s->bitboard[WHITE_PIECES+PAWN];
    pawns[BLACK] = s->bitboard[BLACK_PIECES+PAWN];

    /* Squares attacked by pawns */
    attack[WHITE] = ((pawns[WHITE] & ~(BITBOARD_FILE<<0)) << 7) | ((pawns[WHITE] & ~(BITBOARD_FILE<<7)) << 9);
    attack[BLACK] = ((pawns[BLACK] & ~(BITBOARD_FILE<<0)) >> 9) | ((pawns[BLACK] & ~(BITBOARD_FILE<<7)) >> 7);

    /* Front-fill */
    frontFill[WHITE] = BITBOARD_fill_north(pawns[WHITE]);
    frontFill[BLACK] = BITBOARD_fill_south(pawns[BLACK]);

    /* Attack-span */
    attackSpan[WHITE] = BITBOARD_fill_north(attack[WHITE]);
    attackSpan[BLACK] = BITBOARD_fill_south(attack[BLACK]);

    /* Combined front-fill and attack-span */
    attackFrontFill[WHITE] = frontFill[WHITE] | attackSpan[WHITE];
    attackFrontFill[BLACK] = frontFill[BLACK] | attackSpan[BLACK];

    /* Fill in both directions */
    attackFileFill[WHITE] = BITBOARD_fill_south(attackSpan[WHITE]);
    attackFileFill[BLACK] = BITBOARD_fill_north(attackSpan[BLACK]);

    /* Passed pawns */
    *passedPawns = (pawns[WHITE] & ~attackFrontFill[BLACK]) |
                   (pawns[BLACK] & ~attackFrontFill[WHITE]);

    /* Isolated pawns */
    *isolatedPawns = (pawns[WHITE] & ~attackFileFill[WHITE]) |
                     (pawns[BLACK] & ~attackFileFill[BLACK]);
}